

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

HeapType __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,HeapType type)

{
  Random *this_00;
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  iterator iVar4;
  value_type *pvVar5;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  *__x;
  FeatureOptions<wasm::HeapType> *pFVar6;
  HeapType args;
  HeapType HVar7;
  ulong uVar8;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  local_98;
  undefined1 auStack_68 [8];
  FeatureOptions<wasm::HeapType> options;
  key_type local_30;
  HeapType type_local;
  
  this_00 = &this->random;
  local_30.id = type.id;
  uVar1 = Random::upTo(this_00,3);
  if (uVar1 == 0) {
    return (HeapType)type.id;
  }
  if ((0x7c < type.id) || (uVar1 = Random::upTo(this_00,2), uVar1 != 0)) {
switchD_0014fe4c_default:
    iVar4 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->interestingHeapSubTypes)._M_h,&local_30);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      return (HeapType)local_30.id;
    }
    if (*(long *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x10) ==
        *(long *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x18)) {
      return (HeapType)local_30.id;
    }
    pvVar5 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this_00,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                ((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                                       ._M_cur + 0x10));
    return (HeapType)pvVar5->id;
  }
  iVar2 = wasm::HeapType::getShared();
  if (0x7c < local_30.id) goto LAB_001500a6;
  uVar3 = (uint)local_30.id & 0x7b;
  switch(uVar3 << 0x1d | uVar3 - 8 >> 3) {
  case 0:
    if (((this->wasm->features).features & 0x100) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1557,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar6 = Random::FeatureOptions<wasm::HeapType>::add
                       ((FeatureOptions<wasm::HeapType> *)&local_98,(HeapType)0x8);
    __x = (_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
           *)Random::FeatureOptions<wasm::HeapType>::add<>(pFVar6,(FeatureSet)0x400,(HeapType)0x60);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                *)auStack_68,__x);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~_Rb_tree(&local_98);
    if (iVar2 == 1) {
      Random::FeatureOptions<wasm::HeapType>::add<>
                ((FeatureOptions<wasm::HeapType> *)auStack_68,(FeatureSet)0x4000,(HeapType)0x50);
    }
    HVar7 = Random::pick<wasm::HeapType>(this_00,(FeatureOptions<wasm::HeapType> *)auStack_68);
    goto LAB_00150017;
  case 1:
    if (((this->wasm->features).features & 0x100) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x154f,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&options;
    auStack_68 = (undefined1  [8])0x0;
    options.options._M_t._M_impl._0_8_ = 0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pFVar6 = Random::FeatureOptions<wasm::HeapType>::add
                       ((FeatureOptions<wasm::HeapType> *)auStack_68,(HeapType)0x10);
    pFVar6 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar6,(FeatureSet)0x400,(HeapType)0x68);
    HVar7 = Random::pick<wasm::HeapType>(this_00,pFVar6);
LAB_00150017:
    if (HVar7.id < 0x7d) {
      uVar8 = (ulong)((uint)HVar7.id & 0x7b);
      if (iVar2 == 0) {
        uVar8 = HVar7.id | 4;
      }
      std::
      _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                   *)auStack_68);
      return (HeapType)uVar8;
    }
    goto LAB_001500a6;
  case 2:
    HVar7.id = 0x18;
    args.id = 0x70;
    goto LAB_00150054;
  case 3:
    uVar3 = (this->wasm->features).features;
    if ((uVar3 >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1562,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((uVar3 >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x1563,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    HVar7 = Random::
            pick<wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType>
                      (this_00,(HeapType)0x20,(HeapType)0x28,(HeapType)0x30,(HeapType)0x38,
                       (HeapType)0x40,(HeapType)0x58);
    goto LAB_0015005c;
  case 4:
    uVar3 = (this->wasm->features).features;
    if ((uVar3 >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x156d,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((uVar3 >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x156e,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    HVar7 = Random::pick<wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType,wasm::HeapType>
                      (this_00,(HeapType)0x28,(HeapType)0x30,(HeapType)0x38,(HeapType)0x40,
                       (HeapType)0x58);
    goto LAB_0015005c;
  case 5:
    HVar7.id = 0x30;
    break;
  case 6:
    HVar7.id = 0x38;
    break;
  case 7:
    HVar7.id = 0x40;
    break;
  case 8:
    if (iVar2 == 1) {
      return (HeapType)0x48;
    }
    __assert_fail("share == Unshared",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x157c,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
  case 9:
    if (iVar2 == 1) {
      return (HeapType)0x50;
    }
    __assert_fail("share == Unshared",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x157f,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
  default:
    goto switchD_0014fe4c_default;
  }
  args.id = 0x58;
LAB_00150054:
  HVar7 = Random::pick<wasm::HeapType,wasm::HeapType>(this_00,HVar7,args);
LAB_0015005c:
  if (HVar7.id < 0x7d) {
    uVar8 = (ulong)((uint)HVar7.id & 0x7b);
    if (iVar2 == 0) {
      uVar8 = HVar7.id | 4;
    }
    return (HeapType)uVar8;
  }
LAB_001500a6:
  __assert_fail("isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
}

Assistant:

HeapType TranslateToFuzzReader::getSubType(HeapType type) {
  if (oneIn(3)) {
    return type;
  }
  if (type.isBasic() && oneIn(2)) {
    auto share = type.getShared();
    switch (type.getBasic(Unshared)) {
      case HeapType::func:
        // TODO: Typed function references.
        assert(wasm.features.hasReferenceTypes());
        return pick(FeatureOptions<HeapType>()
                      .add(HeapTypes::func)
                      .add(FeatureSet::GC, HeapTypes::nofunc))
          .getBasic(share);
      case HeapType::cont:
        return pick(HeapTypes::cont, HeapTypes::nocont).getBasic(share);
      case HeapType::ext: {
        assert(wasm.features.hasReferenceTypes());
        auto options = FeatureOptions<HeapType>()
                         .add(HeapTypes::ext)
                         .add(FeatureSet::GC, HeapTypes::noext);
        if (share == Unshared) {
          // Shared strings not yet supported.
          options.add(FeatureSet::Strings, HeapType::string);
        }
        return pick(options).getBasic(share);
      }
      case HeapType::any: {
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapTypes::any,
                    HeapTypes::eq,
                    HeapTypes::i31,
                    HeapTypes::struct_,
                    HeapTypes::array,
                    HeapTypes::none)
          .getBasic(share);
      }
      case HeapType::eq:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapTypes::eq,
                    HeapTypes::i31,
                    HeapTypes::struct_,
                    HeapTypes::array,
                    HeapTypes::none)
          .getBasic(share);
      case HeapType::i31:
        return pick(HeapTypes::i31, HeapTypes::none).getBasic(share);
      case HeapType::struct_:
        return pick(HeapTypes::struct_, HeapTypes::none).getBasic(share);
      case HeapType::array:
        return pick(HeapTypes::array, HeapTypes::none).getBasic(share);
      case HeapType::exn:
        assert(share == Unshared);
        return HeapTypes::exn.getBasic(share);
      case HeapType::string:
        assert(share == Unshared);
        return HeapType::string;
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        break;
    }
  }
  // Look for an interesting subtype.
  auto iter = interestingHeapSubTypes.find(type);
  if (iter != interestingHeapSubTypes.end()) {
    auto& subTypes = iter->second;
    if (!subTypes.empty()) {
      return pick(subTypes);
    }
  }
  // Failure to do anything interesting, return the type.
  return type;
}